

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

void __thiscall
Imf_3_4::CompressedIDManifest::CompressedIDManifest(CompressedIDManifest *this,IDManifest *manifest)

{
  int iVar1;
  size_t __size;
  uchar *puVar2;
  InputExc *this_00;
  size_t sVar3;
  size_t compressedDataSize;
  vector<char,_std::allocator<char>_> serial;
  
  serial.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  serial.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  serial.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  IDManifest::serialize(manifest,&serial);
  sVar3 = (long)serial.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)serial.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  __size = exr_compress_max_buffer_size(sVar3);
  puVar2 = (uchar *)malloc(__size);
  this->_data = puVar2;
  iVar1 = exr_compress_buffer(0,0xffffffffffffffff,
                              serial.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,sVar3,puVar2,__size,
                              &compressedDataSize);
  if (iVar1 == 0) {
    puVar2 = (uchar *)realloc(this->_data,CONCAT44(compressedDataSize._4_4_,(int)compressedDataSize)
                             );
    this->_data = puVar2;
    this->_uncompressedDataSize = sVar3;
    this->_compressedDataSize = (int)compressedDataSize;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&serial.super__Vector_base<char,_std::allocator<char>_>);
    return;
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(this_00,"ID manifest compression failed");
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

CompressedIDManifest::CompressedIDManifest (const IDManifest& manifest)
{
    //
    // make a compressed copy of the manifest by serializing the data into contiguous memory,
    // then calling zlib to compress
    //

    std::vector<char> serial;

    manifest.serialize (serial);

    size_t outputSize = serial.size ();

    //
    // allocate a buffer which is guaranteed to be big enough for compression
    //
    size_t compressedBufferSize = exr_compress_max_buffer_size (outputSize);
    size_t compressedDataSize;
    _data = (unsigned char*) malloc (compressedBufferSize);
    if (EXR_ERR_SUCCESS != exr_compress_buffer (
                               nullptr,
                               -1,
                               serial.data (),
                               outputSize,
                               _data,
                               compressedBufferSize,
                               &compressedDataSize))
    {
        throw IEX_NAMESPACE::InputExc ("ID manifest compression failed");
    }

    // now call realloc to reallocate the buffer to a smaller size - this might free up memory
    _data = (unsigned char*) realloc (_data, compressedDataSize);

    _uncompressedDataSize = outputSize;
    _compressedDataSize   = compressedDataSize;
}